

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Count.cc
# Opt level: O2

void __thiscall Pl_Count::Pl_Count(Pl_Count *this,char *identifier,Pipeline *next)

{
  logic_error *this_00;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Count_002ac338;
  std::make_unique<Pl_Count::Members>();
  if (next != (Pipeline *)0x0) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Attempt to create Pl_Count with nullptr as next");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Pl_Count::Pl_Count(char const* identifier, Pipeline* next) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>())
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_Count with nullptr as next");
    }
}